

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

STAmount *
jbcoin::mulRound(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue,
                bool roundUp)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  bool *pbVar7;
  ulong uVar8;
  uint64_t rounding;
  mantissa_type mVar9;
  int iVar10;
  STAmount *pSVar11;
  mantissa_type mVar12;
  undefined7 in_register_00000081;
  exponent_type eVar13;
  mantissa_type mVar14;
  bool bVar15;
  STAmount result;
  exponent_type local_94;
  undefined4 local_90;
  undefined4 local_8c;
  Issue *local_88;
  mantissa_type local_80;
  STAmount local_78;
  
  if ((v1->mValue == 0) || (v2->mValue == 0)) {
    (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    uVar3 = *(undefined8 *)((issue->currency).pn + 2);
    uVar4 = *(undefined8 *)((issue->currency).pn + 4);
    uVar5 = *(undefined8 *)((issue->account).pn + 1);
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(issue->currency).pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar4;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar5;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
         *(undefined8 *)((issue->account).pn + 3);
    __return_storage_ptr__->mValue = 0;
    __return_storage_ptr__->mOffset = 0;
  }
  else {
    local_78.super_STBase.fName = (SField *)sfGeneric;
    local_78.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    local_78.mIssue.currency.pn._0_8_ = *(undefined8 *)(issue->currency).pn;
    local_78.mIssue.currency.pn._8_8_ = *(undefined8 *)((issue->currency).pn + 2);
    local_78.mIssue._16_8_ = *(undefined8 *)((issue->currency).pn + 4);
    local_78.mIssue.account.pn._4_8_ = *(undefined8 *)((issue->account).pn + 1);
    local_78.mIssue.account.pn._12_8_ = *(undefined8 *)((issue->account).pn + 3);
    local_78.mValue._0_6_ = 0;
    local_78.mValue._6_2_ = 0;
    local_78.mOffset = 0;
    local_78.mIsNegative = false;
    pSVar11 = v1;
    STAmount::canonicalize(&local_78);
    if (local_78.mIssue.currency.pn[0] == 0) {
      uVar8 = 0;
      do {
        uVar6 = uVar8;
        if (uVar6 == 4) {
          uVar6 = 4;
          break;
        }
        uVar8 = uVar6 + 1;
      } while (local_78.mIssue.currency.pn[uVar6 + 1] == 0);
      local_90 = (undefined4)CONCAT71((int7)((ulong)pSVar11 >> 8),3 < uVar6);
    }
    else {
      local_90 = 0;
    }
    if ((v1->mIsNative == true) && (((byte)local_90 & v2->mIsNative) == 1)) {
      if (v2->mIsNative == false) {
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"amount is not native!");
      }
      uVar8 = -v1->mValue;
      if (v1->mIsNegative == false) {
        uVar8 = v1->mValue;
      }
      mVar14 = -v2->mValue;
      if (v2->mIsNegative == false) {
        mVar14 = v2->mValue;
      }
      mVar9 = mVar14;
      if ((long)uVar8 < (long)mVar14) {
        mVar9 = uVar8;
      }
      if (mVar9 < 0xb2d05e01) {
        mVar12 = mVar14;
        if ((long)mVar14 < (long)uVar8) {
          mVar12 = uVar8;
        }
        if ((mVar12 >> 0x20) * mVar9 < 0x7ce66c51) {
          (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
          (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
          (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
          (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
          (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
          (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
          *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
          (__return_storage_ptr__->mIssue).account.pn[1] = 0;
          (__return_storage_ptr__->mIssue).account.pn[2] = 0;
          (__return_storage_ptr__->mIssue).account.pn[3] = 0;
          (__return_storage_ptr__->mIssue).account.pn[4] = 0;
          __return_storage_ptr__->mValue = mVar14 * uVar8;
          __return_storage_ptr__->mOffset = 0;
          __return_storage_ptr__->mIsNative = true;
          __return_storage_ptr__->mIsNegative = false;
          return __return_storage_ptr__;
        }
      }
      Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
    }
    local_8c = (undefined4)CONCAT71(in_register_00000081,roundUp);
    mVar14 = 1000000000000000;
    uVar8 = v1->mValue;
    uVar6 = v2->mValue;
    iVar10 = v1->mOffset;
    if (uVar8 < 1000000000000000 && v1->mIsNative == true) {
      do {
        uVar8 = uVar8 * 10;
        iVar10 = iVar10 + -1;
      } while (uVar8 < 1000000000000000);
    }
    eVar13 = v2->mOffset;
    if ((uVar6 < 1000000000000000) && (v2->mIsNative != false)) {
      do {
        uVar6 = uVar6 * 10;
        eVar13 = eVar13 + -1;
      } while (uVar6 < 1000000000000000);
    }
    bVar1 = v1->mIsNegative;
    bVar2 = v2->mIsNegative;
    rounding = 0;
    bVar15 = (bVar1 != bVar2) != roundUp;
    if (bVar15) {
      rounding = 99999999999999;
    }
    local_88 = issue;
    local_80 = muldiv_round(uVar8,uVar6,100000000000000,rounding);
    local_94 = eVar13 + iVar10 + 0xe;
    if (bVar15) {
      canonicalizeRound((bool)(char)local_90,&local_80,&local_94);
    }
    local_78.mIsNegative = bVar1 != bVar2;
    local_78.super_STBase.fName = (SField *)sfGeneric;
    local_78.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    local_78.mIssue.currency.pn._0_8_ = *(undefined8 *)(local_88->currency).pn;
    local_78.mIssue.currency.pn._8_8_ = *(undefined8 *)((local_88->currency).pn + 2);
    local_78.mIssue._16_8_ = *(undefined8 *)((local_88->currency).pn + 4);
    local_78.mIssue.account.pn._4_8_ = *(undefined8 *)((local_88->account).pn + 1);
    local_78.mIssue.account.pn._12_8_ = *(undefined8 *)((local_88->account).pn + 3);
    local_78.mValue._0_6_ = (undefined6)local_80;
    local_78.mValue._6_2_ = (undefined2)(local_80 >> 0x30);
    local_78.mOffset = local_94;
    STAmount::canonicalize(&local_78);
    if ((((bVar1 != bVar2) || ((char)local_8c == '\0')) ||
        (CONCAT26(local_78.mValue._6_2_,(undefined6)local_78.mValue) != 0)) ||
       (pbVar7 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover),
       *pbVar7 != true)) {
      (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6fc0;
      (__return_storage_ptr__->super_STBase).fName = local_78.super_STBase.fName;
      (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
      *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
           local_78.mIssue.currency.pn._0_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) =
           local_78.mIssue.currency.pn._8_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = local_78.mIssue._16_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) =
           local_78.mIssue.account.pn._4_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
           local_78.mIssue.account.pn._12_8_;
      __return_storage_ptr__->mValue = CONCAT26(local_78.mValue._6_2_,(undefined6)local_78.mValue);
      *(ulong *)((long)&__return_storage_ptr__->mValue + 6) =
           CONCAT17(local_78.mIsNegative,
                    CONCAT16(local_78.mIsNative,CONCAT42(local_78.mOffset,local_78.mValue._6_2_)));
      return __return_storage_ptr__;
    }
    if (((char)local_90 == '\0') ||
       (pbVar7 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover2),
       *pbVar7 == false)) {
      local_94 = -0x60;
    }
    else {
      local_94 = 0;
      mVar14 = 1;
    }
    (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
    (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
    uVar3 = *(undefined8 *)((local_88->currency).pn + 2);
    uVar4 = *(undefined8 *)((local_88->currency).pn + 4);
    uVar5 = *(undefined8 *)((local_88->account).pn + 1);
    *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
         *(undefined8 *)(local_88->currency).pn;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar4;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar5;
    *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
         *(undefined8 *)((local_88->account).pn + 3);
    __return_storage_ptr__->mValue = mVar14;
    __return_storage_ptr__->mOffset = local_94;
    local_80 = mVar14;
  }
  __return_storage_ptr__->mIsNegative = false;
  STAmount::canonicalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

STAmount
mulRound (STAmount const& v1, STAmount const& v2, Issue const& issue,
    bool roundUp)
{
    if (v1 == zero || v2 == zero)
        return {issue};

    bool const xrp = isXRP (issue);

    if (v1.native() && v2.native() && xrp)
    {
        std::uint64_t minV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v1) : getSNValue (v2);
        std::uint64_t maxV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa(), value2 = v2.mantissa();
    int offset1 = v1.exponent(), offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    bool const resultNegative = v1.negative() != v2.negative();

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    //
    // If the we're rounding up, we want to round up away
    // from zero, and if we're rounding down, truncation
    // is implicit.
    std::uint64_t amount = muldiv_round (
        value1, value2, tenTo14,
        (resultNegative != roundUp) ? tenTo14m1 : 0);

    int offset = offset1 + offset2 + 14;
    if (resultNegative != roundUp)
        canonicalizeRound (xrp, amount, offset);
    STAmount result (issue, amount, offset, resultNegative);

    // Control when bugfixes that require switchover dates are enabled
    if (roundUp && !resultNegative && !result && *stAmountCalcSwitchover)
    {
        if (xrp && *stAmountCalcSwitchover2)
        {
            // return the smallest value above zero
            amount = 1;
            offset = 0;
        }
        else
        {
            // return the smallest value above zero
            amount = STAmount::cMinValue;
            offset = STAmount::cMinOffset;
        }
        return STAmount(issue, amount, offset, resultNegative);
    }
    return result;
}